

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O3

void __thiscall pbrt::ThreadPool::ForEachThread(ThreadPool *this,function<void_()> *func)

{
  pointer ptVar1;
  pointer ptVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 *local_68;
  function<void_()> *local_60;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  puVar3 = (undefined8 *)operator_new(0x60);
  ptVar1 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar2 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3[4] = 0;
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  iVar4 = (int)((ulong)((long)ptVar1 - (long)ptVar2) >> 3) + 1;
  std::condition_variable::condition_variable((condition_variable *)(puVar3 + 5));
  *(int *)(puVar3 + 0xb) = iVar4;
  *(int *)((long)puVar3 + 0x5c) = iVar4;
  local_50 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.cpp:178:40)>
             ::_M_invoke;
  local_48._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.cpp:178:40)>
             ::_M_manager;
  local_30 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
             ::_M_manager;
  local_68 = puVar3;
  local_60 = func;
  local_48._M_unused._M_object = &local_68;
  ParallelFor(0,((long)(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) + 1,
              (function<void_(long,_long)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  return;
}

Assistant:

void ThreadPool::ForEachThread(std::function<void(void)> func) {
    Barrier *barrier = new Barrier(threads.size() + 1);

    ParallelFor(0, threads.size() + 1, [barrier, &func](int64_t) {
        func();
        if (barrier->Block())
            delete barrier;
    });
}